

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainwindow.cpp
# Opt level: O1

void __thiscall
FSSMainWindow::onCurrentChanged(FSSMainWindow *this,QModelIndex *current,QModelIndex *param_2)

{
  QAbstractItemModel *pQVar1;
  uint _t2;
  Resource _t1;
  long local_28 [3];
  
  pQVar1 = current->m;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    local_28[0] = -1;
    local_28[1] = 0;
    local_28[2] = 0;
  }
  else {
    (**(code **)(*(long *)pQVar1 + 0x68))(local_28,pQVar1,current);
  }
  if ((((int)local_28[0] < 0) || (local_28[0] < 0)) || (local_28[2] == 0)) {
    _t1 = AssetNone;
    _t2 = 0;
  }
  else {
    pQVar1 = current->m;
    if (pQVar1 == (QAbstractItemModel *)0x0) {
      local_28[0] = -1;
      local_28[1] = 0;
      local_28[2] = 0;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x68))(local_28,pQVar1,current);
    }
    _t1 = (int)local_28[0] + AssetArtLandscape;
    _t2 = current->r;
  }
  resourceSelected(this,_t1,_t2);
  return;
}

Assistant:

void
FSSMainWindow::onCurrentChanged(const QModelIndex &current,
                                const QModelIndex & /*previous*/) {
  Data::Resource resource_class = Data::AssetNone;
  unsigned int index = 0;

  if (current.parent().isValid()) {
    resource_class = (Data::Resource)(current.parent().row() + 1);
    index = current.row();
  }

  emit resourceSelected(resource_class, index);
}